

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_simd.cpp
# Opt level: O1

void multikey_simd_b<unsigned_int>
               (uchar **strings,size_t N,size_t depth,uchar **sorted,uint8_t *oracle)

{
  byte *pbVar1;
  uchar *puVar2;
  long lVar3;
  uchar *puVar4;
  undefined8 N_00;
  undefined8 N_01;
  uint j;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uchar **ppuVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uchar **ppuVar15;
  byte bVar16;
  uint uVar17;
  uint uVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  char cVar30;
  undefined1 auVar29 [16];
  int iVar32;
  undefined1 auVar35 [16];
  int iVar36;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar42;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar48;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ulong local_d0;
  undefined1 local_98 [16];
  ulong local_88;
  size_t local_80;
  uchar **local_78;
  uint8_t *local_70;
  long local_68 [4];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int iVar31;
  undefined1 auVar33 [12];
  undefined1 auVar34 [16];
  undefined1 auVar37 [12];
  undefined1 auVar38 [16];
  undefined1 auVar43 [12];
  undefined1 auVar44 [16];
  undefined1 auVar49 [12];
  undefined1 auVar50 [16];
  
  local_80 = depth + 4;
  local_78 = sorted;
  local_70 = oracle;
  do {
    if (N < 0x20) {
      if (1 < (long)N) {
        ppuVar9 = strings;
        do {
          iVar31 = (int)N;
          N = (size_t)(iVar31 - 1);
          puVar2 = ppuVar9[1];
          ppuVar9 = ppuVar9 + 1;
          for (ppuVar15 = ppuVar9; strings < ppuVar15; ppuVar15 = ppuVar15 + -1) {
            puVar4 = ppuVar15[-1];
            bVar16 = puVar4[depth];
            bVar19 = puVar2[depth];
            if ((bVar16 != 0) && (lVar7 = depth + 1, bVar16 == bVar19)) {
              do {
                bVar16 = puVar4[lVar7];
                bVar19 = puVar2[lVar7];
                if (bVar16 == 0) break;
                lVar7 = lVar7 + 1;
              } while (bVar16 == bVar19);
            }
            if (bVar16 <= bVar19) break;
            *ppuVar15 = puVar4;
          }
          *ppuVar15 = puVar2;
        } while (2 < iVar31);
      }
      return;
    }
    uVar5 = pseudo_median<unsigned_int>(strings,N,depth);
    ppuVar9 = local_78;
    local_98 = (undefined1  [16])0x0;
    local_88 = 0;
    uVar11 = N & 0xfffffffffffffff0;
    if (uVar11 != 0) {
      cVar30 = (char)(uVar5 >> 0x18);
      local_48._0_3_ = (undefined3)uVar5;
      local_48 = CONCAT13(cVar30 + -0x80,(undefined3)local_48);
      uStack_44 = CONCAT13(cVar30 + -0x80,(undefined3)local_48);
      uStack_40 = CONCAT13(cVar30 + -0x80,(undefined3)local_48);
      uStack_3c = CONCAT13(cVar30 + -0x80,(undefined3)local_48);
      uVar10 = 0;
      do {
        lVar7 = 0;
        do {
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x10);
        puVar2 = strings[uVar10];
        if (puVar2 == (uchar *)0x0) goto LAB_0021a681;
        if (puVar2[depth] == 0) {
          uVar28 = 0;
        }
        else {
          uVar28 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar28 = uVar28 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar28 = uVar28 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        puVar2 = strings[uVar10 + 4];
        if (puVar2 == (uchar *)0x0) goto LAB_0021a681;
        if (puVar2[depth] == 0) {
          uVar24 = 0;
        }
        else {
          uVar24 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar24 = uVar24 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar24 = uVar24 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        puVar2 = strings[uVar10 + 8];
        if (puVar2 == (uchar *)0x0) goto LAB_0021a681;
        if (puVar2[depth] == 0) {
          uVar22 = 0;
        }
        else {
          uVar22 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar22 = uVar22 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar22 = uVar22 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        puVar2 = strings[uVar10 + 0xc];
        if (puVar2 == (uchar *)0x0) goto LAB_0021a681;
        if (puVar2[depth] == 0) {
          uVar20 = 0;
        }
        else {
          uVar20 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar20 = uVar20 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar20 = uVar20 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        puVar2 = strings[uVar10 + 1];
        if (puVar2 == (uchar *)0x0) goto LAB_0021a681;
        if (puVar2[depth] == 0) {
          uVar17 = 0;
        }
        else {
          uVar17 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar17 = uVar17 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar17 = uVar17 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        puVar2 = strings[uVar10 + 5];
        if (puVar2 == (uchar *)0x0) goto LAB_0021a681;
        if (puVar2[depth] == 0) {
          uVar13 = 0;
        }
        else {
          uVar13 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar13 = uVar13 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar13 = uVar13 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        puVar2 = strings[uVar10 + 9];
        if (puVar2 == (uchar *)0x0) goto LAB_0021a681;
        if (puVar2[depth] == 0) {
          uVar26 = 0;
        }
        else {
          uVar26 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar26 = uVar26 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar26 = uVar26 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        puVar2 = strings[uVar10 + 0xd];
        if (puVar2 == (uchar *)0x0) goto LAB_0021a681;
        if (puVar2[depth] == 0) {
          local_d0 = 0;
        }
        else {
          uVar25 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar25 = uVar25 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar25 = uVar25 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
          local_d0 = (ulong)uVar25;
        }
        puVar2 = strings[uVar10 + 2];
        if (puVar2 == (uchar *)0x0) goto LAB_0021a681;
        if (puVar2[depth] == 0) {
          uVar25 = 0;
        }
        else {
          uVar25 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar25 = uVar25 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar25 = uVar25 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        puVar2 = strings[uVar10 + 6];
        if (puVar2 == (uchar *)0x0) goto LAB_0021a681;
        if (puVar2[depth] == 0) {
          uVar27 = 0;
        }
        else {
          uVar27 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar27 = uVar27 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar27 = uVar27 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        puVar2 = strings[uVar10 + 10];
        if (puVar2 == (uchar *)0x0) goto LAB_0021a681;
        if (puVar2[depth] == 0) {
          uVar12 = 0;
        }
        else {
          uVar12 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar12 = uVar12 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar12 = uVar12 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        puVar2 = strings[uVar10 + 0xe];
        if (puVar2 == (uchar *)0x0) goto LAB_0021a681;
        if (puVar2[depth] == 0) {
          uVar6 = 0;
        }
        else {
          uVar6 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar6 = uVar6 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar6 = uVar6 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        puVar2 = strings[uVar10 + 3];
        if (puVar2 == (uchar *)0x0) goto LAB_0021a681;
        if (puVar2[depth] == 0) {
          uVar14 = 0;
        }
        else {
          uVar14 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar14 = uVar14 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar14 = uVar14 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        puVar2 = strings[uVar10 + 7];
        if (puVar2 == (uchar *)0x0) goto LAB_0021a681;
        if (puVar2[depth] == 0) {
          uVar18 = 0;
        }
        else {
          uVar18 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar18 = uVar18 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar18 = uVar18 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        puVar2 = strings[uVar10 + 0xb];
        if (puVar2 == (uchar *)0x0) goto LAB_0021a681;
        if (puVar2[depth] == 0) {
          uVar21 = 0;
        }
        else {
          uVar21 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar21 = uVar21 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar21 = uVar21 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        puVar2 = strings[uVar10 + 0xf];
        if (puVar2 == (uchar *)0x0) goto LAB_0021a681;
        if (puVar2[depth] == 0) {
          uVar23 = 0;
        }
        else {
          uVar23 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar23 = uVar23 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar23 = uVar23 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        iVar32 = CONCAT22((short)(uVar28 >> 0x10) + -0x8000,(short)uVar28);
        auVar33._0_8_ = CONCAT26((short)(uVar24 >> 0x10) + -0x8000,CONCAT24((short)uVar24,iVar32));
        auVar33._8_2_ = (undefined2)uVar22;
        auVar33._10_2_ = (short)(uVar22 >> 0x10) + -0x8000;
        auVar34._12_2_ = (undefined2)uVar20;
        auVar34._0_12_ = auVar33;
        auVar34._14_2_ = (short)(uVar20 >> 0x10) + -0x8000;
        iVar36 = CONCAT22((short)(uVar17 >> 0x10) + -0x8000,(short)uVar17);
        auVar37._0_8_ = CONCAT26((short)(uVar13 >> 0x10) + -0x8000,CONCAT24((short)uVar13,iVar36));
        auVar37._8_2_ = (undefined2)uVar26;
        auVar37._10_2_ = (short)(uVar26 >> 0x10) + -0x8000;
        auVar38._12_2_ = (undefined2)local_d0;
        auVar38._0_12_ = auVar37;
        auVar38._14_2_ = (short)(local_d0 >> 0x10) + -0x8000;
        iVar42 = CONCAT22((short)(uVar25 >> 0x10) + -0x8000,(short)uVar25);
        auVar43._0_8_ = CONCAT26((short)(uVar27 >> 0x10) + -0x8000,CONCAT24((short)uVar27,iVar42));
        auVar43._8_2_ = (undefined2)uVar12;
        auVar43._10_2_ = (short)(uVar12 >> 0x10) + -0x8000;
        auVar44._12_2_ = (undefined2)uVar6;
        auVar44._0_12_ = auVar43;
        auVar44._14_2_ = (short)(uVar6 >> 0x10) + -0x8000;
        iVar48 = CONCAT22((short)(uVar14 >> 0x10) + -0x8000,(short)uVar14);
        auVar49._0_8_ = CONCAT26((short)(uVar18 >> 0x10) + -0x8000,CONCAT24((short)uVar18,iVar48));
        auVar49._8_2_ = (undefined2)uVar21;
        auVar49._10_2_ = (short)(uVar21 >> 0x10) + -0x8000;
        auVar50._12_2_ = (undefined2)uVar23;
        auVar50._0_12_ = auVar49;
        auVar50._14_2_ = (short)(uVar23 >> 0x10) + -0x8000;
        auVar29._0_4_ = -(uint)(iVar32 == local_48);
        iVar31 = (int)((ulong)auVar33._0_8_ >> 0x20);
        auVar29._4_4_ = -(uint)(iVar31 == uStack_44);
        auVar29._8_4_ = -(uint)(auVar33._8_4_ == uStack_40);
        auVar29._12_4_ = -(uint)(auVar34._12_4_ == uStack_3c);
        auVar35._0_4_ = -(uint)(local_48 < iVar32);
        auVar35._4_4_ = -(uint)(uStack_44 < iVar31);
        auVar35._8_4_ = -(uint)(uStack_40 < auVar33._8_4_);
        auVar35._12_4_ = -(uint)(uStack_3c < auVar34._12_4_);
        auVar40._0_4_ = -(uint)(iVar36 == local_48);
        iVar31 = (int)((ulong)auVar37._0_8_ >> 0x20);
        auVar40._4_4_ = -(uint)(iVar31 == uStack_44);
        auVar40._8_4_ = -(uint)(auVar37._8_4_ == uStack_40);
        auVar40._12_4_ = -(uint)(auVar38._12_4_ == uStack_3c);
        auVar39._0_4_ = -(uint)(local_48 < iVar36);
        auVar39._4_4_ = -(uint)(uStack_44 < iVar31);
        auVar39._8_4_ = -(uint)(uStack_40 < auVar37._8_4_);
        auVar39._12_4_ = -(uint)(uStack_3c < auVar38._12_4_);
        auVar40 = auVar39 & _DAT_00265fd0 | auVar40 & _DAT_00265fc0;
        auVar46._0_4_ = -(uint)(iVar42 == local_48);
        iVar31 = (int)((ulong)auVar43._0_8_ >> 0x20);
        auVar46._4_4_ = -(uint)(iVar31 == uStack_44);
        auVar46._8_4_ = -(uint)(auVar43._8_4_ == uStack_40);
        auVar46._12_4_ = -(uint)(auVar44._12_4_ == uStack_3c);
        auVar45._0_4_ = -(uint)(local_48 < iVar42);
        auVar45._4_4_ = -(uint)(uStack_44 < iVar31);
        auVar45._8_4_ = -(uint)(uStack_40 < auVar43._8_4_);
        auVar45._12_4_ = -(uint)(uStack_3c < auVar44._12_4_);
        auVar46 = auVar45 & _DAT_00265fd0 | auVar46 & _DAT_00265fc0;
        auVar52._0_4_ = -(uint)(iVar48 == local_48);
        iVar31 = (int)((ulong)auVar49._0_8_ >> 0x20);
        auVar52._4_4_ = -(uint)(iVar31 == uStack_44);
        auVar52._8_4_ = -(uint)(auVar49._8_4_ == uStack_40);
        auVar52._12_4_ = -(uint)(auVar50._12_4_ == uStack_3c);
        auVar51._0_4_ = -(uint)(local_48 < iVar48);
        auVar51._4_4_ = -(uint)(uStack_44 < iVar31);
        auVar51._8_4_ = -(uint)(uStack_40 < auVar49._8_4_);
        auVar51._12_4_ = -(uint)(uStack_3c < auVar50._12_4_);
        auVar52 = auVar51 & _DAT_00265fd0 | auVar52 & _DAT_00265fc0;
        auVar41._0_8_ = auVar40._0_8_ << 8;
        auVar41._8_8_ = auVar40._8_8_ << 8;
        auVar47._0_8_ = auVar46._0_8_ << 0x10;
        auVar47._8_8_ = auVar46._8_8_ << 0x10;
        auVar53._0_8_ = auVar52._0_8_ << 0x18;
        auVar53._8_8_ = auVar52._8_8_ << 0x18;
        *(undefined1 (*) [16])(local_70 + uVar10) =
             auVar53 | auVar47 | auVar41 | auVar35 & _DAT_00265fd0 | auVar29 & _DAT_00265fc0;
        uVar10 = uVar10 + 0x10;
        oracle = local_70;
      } while (uVar10 < uVar11);
    }
    if (uVar11 != N) {
      do {
        puVar2 = strings[uVar11];
        if (puVar2 == (uchar *)0x0) {
LAB_0021a681:
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                        ,0x38,"uint32_t get_char(unsigned char *, size_t)");
        }
        if (puVar2[depth] == 0) {
          uVar28 = 0;
        }
        else {
          uVar28 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar28 = uVar28 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar28 = uVar28 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        oracle[uVar11] = (uVar5 <= uVar28 && uVar28 != uVar5) * '\x02' | uVar28 == uVar5;
        uVar11 = uVar11 + 1;
      } while (uVar11 < N);
    }
    lVar8 = N + (N == 0);
    lVar7 = 0;
    do {
      *(long *)(local_98 + (ulong)oracle[lVar7] * 8) =
           *(long *)(local_98 + (ulong)oracle[lVar7] * 8) + 1;
      uVar11 = local_88;
      lVar7 = lVar7 + 1;
    } while (lVar8 != lVar7);
    N_00 = local_98._0_8_;
    N_01 = local_98._8_8_;
    if (local_98._8_8_ + local_98._0_8_ + local_88 != N) {
      __assert_fail("bucketsize[0] + bucketsize[1] + bucketsize[2] == N",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_simd.cpp"
                    ,0x166,
                    "void multikey_simd_b(unsigned char **, size_t, size_t, unsigned char **__restrict, uint8_t *__restrict) [CharT = unsigned int]"
                   );
    }
    local_68[0] = 0;
    local_68[1] = local_98._0_8_;
    local_68[2] = local_98._8_8_ + local_98._0_8_;
    lVar7 = 0;
    do {
      puVar2 = strings[lVar7];
      pbVar1 = oracle + lVar7;
      lVar7 = lVar7 + 1;
      lVar3 = local_68[*pbVar1];
      local_68[*pbVar1] = lVar3 + 1;
      ppuVar9[lVar3] = puVar2;
    } while (lVar8 != lVar7);
    memcpy(strings,ppuVar9,N << 3);
    multikey_simd_b<unsigned_int>(strings,N_00,depth,ppuVar9,oracle);
    if ((char)uVar5 != '\0') {
      multikey_simd_b<unsigned_int>(strings + N_00,N_01,local_80,ppuVar9,oracle);
    }
    strings = strings + N_00 + N_01;
    N = uVar11;
  } while( true );
}

Assistant:

static void
multikey_simd_b(unsigned char** strings, size_t N, size_t depth,
		unsigned char** restrict sorted, uint8_t* restrict oracle)
{
	if (N < 32) {
		insertion_sort(strings, N, depth);
		return;
	}
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	size_t i=N-N%16;
	calculate_bucketsizes_sse<true>(strings, i, oracle, partval, depth);
	for (; i < N; ++i)
		oracle[i] = get_bucket(
				get_char<CharT>(strings[i], depth),
				partval);
	for (i=0; i < N; ++i) {
		__builtin_prefetch(&oracle[i+1]);
		++bucketsize[oracle[i]];
	}
	assert(bucketsize[0] + bucketsize[1] + bucketsize[2] == N);
	size_t bucketindex[3];
	bucketindex[0] = 0;
	bucketindex[1] = bucketsize[0];
	bucketindex[2] = bucketsize[0] + bucketsize[1];
	for (size_t i=0; i < N; ++i) {
		__builtin_prefetch(&oracle[i+1]);
		sorted[bucketindex[oracle[i]]++] = strings[i];
	}
	std::copy(sorted, sorted+N, strings);
	multikey_simd_b<CharT>(strings, bucketsize[0], depth,
			sorted, oracle);
	if (not is_end(partval))
		multikey_simd_b<CharT>(strings+bucketsize[0],
				bucketsize[1], depth+sizeof(CharT),
				sorted, oracle);
	multikey_simd_b<CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth, sorted, oracle);
}